

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<char_const(&)[17],char*>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,char (*args) [17],
          char **args_1)

{
  format_args args_00;
  string_view fmt_00;
  char *s;
  size_t count;
  char **in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  v9 *in_R8;
  char (*in_R9) [17];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  log_msg *in_stack_00000018;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  buffer<char> *in_stack_fffffffffffffb88;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  logger *in_stack_fffffffffffffb98;
  logger *in_stack_fffffffffffffba0;
  unsigned_long_long in_stack_fffffffffffffbc8;
  buffer<char> *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  size_t in_stack_fffffffffffffbe0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> out;
  level_enum lvl_00;
  log_msg *in_stack_fffffffffffffc00;
  string_view_t in_stack_fffffffffffffc08;
  string_view_t in_stack_fffffffffffffc18;
  source_loc in_stack_fffffffffffffc30;
  basic_string_view<char> local_368 [2];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_340;
  log_msg *local_338;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_2d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[17],_char_*>
  local_2c8;
  undefined8 local_2a8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[17],_char_*>
  *local_2a0;
  undefined8 local_298;
  char **ppcStack_290;
  undefined1 local_269 [295];
  undefined1 local_142;
  byte local_141;
  char (*local_140) [17];
  v9 *local_138;
  undefined8 local_120;
  char **ppcStack_118;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[17],_char_*>
  *local_110;
  undefined8 *local_108;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[17],_char_*>
  *local_100;
  undefined8 local_f8;
  undefined8 *local_f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[17],_char_*>
  *local_28;
  
  lvl_00 = (level_enum)((ulong)in_RDI >> 0x20);
  local_140 = in_R9;
  local_138 = in_R8;
  local_120 = in_RDX;
  ppcStack_118 = in_RCX;
  local_141 = should_log(in_stack_fffffffffffffb98,
                         (level_enum)((ulong)in_stack_fffffffffffffb90 >> 0x20));
  local_142 = details::backtracer::enabled((backtracer *)0x7906d3);
  if (((local_141 & 1) != 0) || ((bool)local_142)) {
    out.container = (buffer<char> *)local_269;
    std::allocator<char>::allocator();
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffb90,(allocator<char> *)in_stack_fffffffffffffb88);
    std::allocator<char>::~allocator((allocator<char> *)local_269);
    ::fmt::v9::appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    local_298 = local_120;
    ppcStack_290 = ppcStack_118;
    ::fmt::v9::
    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const(&)[17],char*&>
              (&local_2c8,local_138,local_140,in_RCX);
    local_108 = &local_2a8;
    local_110 = &local_2c8;
    local_f8 = 0xcc;
    local_2a8 = 0xcc;
    fmt_00.data_._4_4_ = in_stack_fffffffffffffbdc;
    fmt_00.data_._0_4_ = in_stack_fffffffffffffbd8;
    fmt_00.size_ = in_stack_fffffffffffffbe0;
    args_00.field_1.values_ = in_stack_fffffffffffffbd0.values_;
    args_00.desc_ = in_stack_fffffffffffffbc8;
    local_100 = local_110;
    local_f0 = local_108;
    local_28 = local_110;
    local_2a0 = local_110;
    local_2d0.container =
         (buffer<char> *)::fmt::v9::vformat_to<fmt::v9::appender,_0>(out.container,fmt_00,args_00);
    local_338 = in_stack_00000018;
    pbStack_340 = in_stack_00000010;
    ::fmt::v9::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffb90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb88);
    this_00 = (buffer<char> *)(local_269 + 1);
    s = ::fmt::v9::detail::buffer<char>::data(this_00);
    count = ::fmt::v9::detail::buffer<char>::size(this_00);
    ::fmt::v9::basic_string_view<char>::basic_string_view(local_368,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffc30,in_stack_fffffffffffffc18,lvl_00,
               in_stack_fffffffffffffc08);
    log_it_(in_stack_fffffffffffffba0,local_338,SUB81((ulong)pbStack_340 >> 0x38,0),
            SUB81((ulong)pbStack_340 >> 0x30,0));
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (pbStack_340);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }